

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  atomic<unsigned_long> *paVar1;
  Topology *pTVar2;
  Semaphores *pSVar3;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  first;
  undefined8 *puVar4;
  Node *pNVar5;
  Node *pNVar6;
  bool bVar7;
  uint uVar8;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  _Var9;
  ulong uVar10;
  undefined8 uVar11;
  _Any_data *work;
  atomic<unsigned_long> *paVar12;
  Worker *pWVar13;
  iterator __begin1;
  _Hash_node_base *p_Var14;
  undefined8 *puVar15;
  id iVar16;
  bool bVar17;
  Node *cache;
  SmallVector<tf::Node_*,_2U> waiters;
  SmallVector<int,_2U> conds;
  Node *local_80;
  Node **local_78;
  Node **local_70;
  thread *local_68;
  Node *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40;
  undefined1 local_38 [8];
  
  pWVar13 = worker;
  do {
    local_80 = (Node *)0x0;
    if ((node->_nstate & 0x20000000) == 0) {
      pTVar2 = node->_topology;
      if (((pTVar2 == (Topology *)0x0) ||
          (((uint)(pTVar2->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)) &&
         ((node->_parent == (Node *)0x0 ||
          (((uint)(node->_parent->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)))) {
        pSVar3 = (node->_semaphores)._M_t.
                 super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
        if ((pSVar3 != (Semaphores *)0x0) && (*(long *)pSVar3 != *(long *)&pSVar3->field_0x8)) {
          local_78 = local_60;
          local_68 = (thread *)local_50;
          pWVar13 = (Worker *)&local_78;
          local_70 = local_78;
          bVar7 = Node::_acquire_all(node,(SmallVector<tf::Node_*,_2U> *)&local_78);
          if (bVar7) {
            if (local_78 != local_60) {
              free(local_78);
            }
          }
          else {
            pWVar13 = worker;
            _schedule<tf::Node**>(this,worker,local_78,local_70);
            if (local_78 != local_60) {
              free(local_78);
            }
            bVar17 = true;
            if (!bVar7) goto LAB_00107587;
          }
        }
        goto LAB_001071ac;
      }
      pNVar5 = node->_parent;
      if (pNVar5 == (Node *)0x0) {
        LOCK();
        paVar12 = &pTVar2->_join_counter;
        (paVar12->super___atomic_base<unsigned_long>)._M_i =
             (paVar12->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        if ((paVar12->super___atomic_base<unsigned_long>)._M_i == 0) {
          pWVar13 = worker;
          _tear_down_topology(this,worker,node->_topology);
        }
      }
      else {
        uVar8 = pNVar5->_nstate;
        LOCK();
        paVar12 = &pNVar5->_join_counter;
        (paVar12->super___atomic_base<unsigned_long>)._M_i =
             (paVar12->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        if (((paVar12->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar8 & 0x20000000) != 0)
           ) {
          local_80 = pNVar5;
        }
      }
      bVar17 = local_80 == (Node *)0x0;
      if (!bVar17) {
        node = local_80;
      }
      goto LAB_00107587;
    }
LAB_001071ac:
    local_50._0_8_ = local_38;
    local_40 = &stack0xffffffffffffffd0;
    uVar8 = (uint)(node->_handle).
                  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  ._M_index;
    local_50._8_8_ = local_50._0_8_;
    if (7 < uVar8 - 1) goto LAB_001073a9;
    work = (_Any_data *)&node->_handle;
    switch(uVar8) {
    case 1:
      for (p_Var14 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
        pWVar13 = worker;
        (*(code *)(p_Var14[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var14[1]._M_nxt,worker,node);
      }
      if ((node->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_index != '\x01') {
        work = (_Any_data *)0x0;
      }
      if (*(long *)(work + 1) == 0) {
        uVar11 = std::__throw_bad_function_call();
        if (local_78 != local_60) {
          free(local_78);
        }
        _Unwind_Resume(uVar11);
      }
      (**(code **)((long)work + 0x18))(work,(Runtime *)pWVar13);
      for (p_Var14 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
        pWVar13 = worker;
        (*(code *)(p_Var14[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var14[1]._M_nxt,worker,node);
      }
      break;
    case 2:
      if ((node->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_index != '\x02') {
        work = (_Any_data *)0x0;
      }
      pWVar13 = worker;
      bVar7 = _invoke_runtime_task_impl(this,worker,node,(function<void_(tf::Runtime_&)> *)work);
      goto LAB_001072b1;
    case 3:
      pWVar13 = worker;
      bVar7 = _invoke_subflow_task(this,worker,node);
LAB_001072b1:
      bVar17 = true;
      if (bVar7 == false) break;
      goto LAB_00107573;
    case 4:
      pWVar13 = worker;
      _invoke_condition_task(this,worker,node,(SmallVector<int,_2U> *)local_50);
      break;
    case 5:
      pWVar13 = worker;
      _invoke_multi_condition_task(this,worker,node,(SmallVector<int,_2U> *)local_50);
      break;
    case 6:
      puVar15 = *(undefined8 **)
                 &(((handle_t *)work)->
                  super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  ).
                  super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  .
                  super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ;
      first._M_current = (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)*puVar15;
      _Var9._M_current = (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)puVar15[1];
      if (first._M_current != _Var9._M_current) {
        uVar8 = node->_nstate;
        if ((uVar8 >> 0x1d & 1) == 0) {
          node->_nstate = uVar8 | 0x20000000;
          _Var9 = _set_up_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                            (this,first,_Var9,node->_topology,node);
          LOCK();
          (node->_join_counter).super___atomic_base<unsigned_long>._M_i =
               (node->_join_counter).super___atomic_base<unsigned_long>._M_i +
               ((long)_Var9._M_current - (long)first._M_current >> 3);
          UNLOCK();
          bVar17 = true;
          pWVar13 = worker;
          _schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                    (this,worker,first,_Var9);
          goto LAB_00107573;
        }
        node->_nstate = uVar8 & 0xdfffffff;
      }
      break;
    case 7:
      pWVar13 = worker;
      bVar7 = _invoke_async_task(this,worker,node);
      bVar17 = true;
      if (bVar7) goto LAB_00107573;
      pWVar13 = worker;
      _tear_down_async(this,worker,node,&local_80);
      pNVar5 = local_80;
      goto LAB_00107563;
    case 8:
      pWVar13 = worker;
      bVar7 = _invoke_dependent_async_task(this,worker,node);
      bVar17 = true;
      if (!bVar7) {
        pWVar13 = worker;
        _tear_down_dependent_async(this,worker,node,&local_80);
        pNVar5 = local_80;
        goto LAB_00107563;
      }
      goto LAB_00107573;
    }
LAB_001073a9:
    pSVar3 = (node->_semaphores)._M_t.
             super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
             ._M_t.
             super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
             .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
    if ((pSVar3 != (Semaphores *)0x0) &&
       (puVar15 = *(undefined8 **)&pSVar3->to_release,
       puVar15 != *(undefined8 **)&pSVar3->field_0x30)) {
      local_78 = local_60;
      local_68 = (thread *)local_50;
      puVar4 = *(undefined8 **)&pSVar3->field_0x30;
      local_70 = local_78;
      for (; puVar15 != puVar4; puVar15 = puVar15 + 1) {
        Semaphore::_release((Semaphore *)*puVar15,(SmallVector<tf::Node_*,_2U> *)&local_78);
      }
      pWVar13 = worker;
      _schedule<tf::Node**>(this,worker,local_78,local_70);
      if (local_78 != local_60) {
        free(local_78);
      }
    }
    uVar11 = local_50._8_8_;
    LOCK();
    (node->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (node->_join_counter).super___atomic_base<unsigned_long>._M_i +
         (((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
           (long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                 super_SmallVectorTemplateBase<tf::Node_*,_true>.
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3
          ) - ((ulong)(node->_nstate & 0xfffffff) + node->_num_successors));
    UNLOCK();
    if (node->_parent == (Node *)0x0) {
      paVar12 = &node->_topology->_join_counter;
    }
    else {
      paVar12 = &node->_parent->_join_counter;
    }
    iVar16._M_thread = local_50._0_8_;
    if (((node->_handle).
         super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         .
         super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         .
         super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         .
         super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         .
         super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         .
         super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         ._M_index & 0xfe) == 4) {
      for (; iVar16._M_thread != uVar11;
          iVar16._M_thread = (native_handle_type)(iVar16._M_thread + 4)) {
        uVar10 = (ulong)*(int *)iVar16._M_thread;
        pNVar5 = local_80;
        if ((-1 < (long)uVar10) && (uVar10 < node->_num_successors)) {
          pNVar5 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                    super_SmallVectorBase.BeginX + uVar10 * 8);
          (pNVar5->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
          LOCK();
          (paVar12->super___atomic_base<unsigned_long>)._M_i =
               (paVar12->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          if (local_80 != (Node *)0x0) {
            pWVar13 = worker;
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar5;
      }
    }
    else if (node->_num_successors != 0) {
      uVar10 = 0;
      do {
        pNVar5 = *(Node **)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                  super_SmallVectorBase.BeginX + uVar10 * 8);
        LOCK();
        paVar1 = &pNVar5->_join_counter;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        pNVar6 = local_80;
        if ((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) {
          LOCK();
          (paVar12->super___atomic_base<unsigned_long>)._M_i =
               (paVar12->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          pNVar6 = pNVar5;
          if (local_80 != (Node *)0x0) {
            pWVar13 = worker;
            _schedule(this,worker,local_80);
          }
        }
        local_80 = pNVar6;
        uVar10 = uVar10 + 1;
      } while (uVar10 < node->_num_successors);
    }
    pNVar6 = node->_parent;
    pNVar5 = local_80;
    if (pNVar6 == (Node *)0x0) {
      LOCK();
      paVar12 = &node->_topology->_join_counter;
      (paVar12->super___atomic_base<unsigned_long>)._M_i =
           (paVar12->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar12->super___atomic_base<unsigned_long>)._M_i == 0) {
        pWVar13 = worker;
        _tear_down_topology(this,worker,node->_topology);
        pNVar5 = local_80;
      }
    }
    else {
      uVar8 = pNVar6->_nstate;
      LOCK();
      paVar12 = &pNVar6->_join_counter;
      (paVar12->super___atomic_base<unsigned_long>)._M_i =
           (paVar12->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((((paVar12->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar8 & 0x20000000) != 0))
         && (pNVar5 = pNVar6, local_80 != (Node *)0x0)) {
        pWVar13 = worker;
        _schedule(this,worker,local_80);
      }
    }
LAB_00107563:
    local_80 = pNVar5;
    bVar17 = local_80 == (Node *)0x0;
    if (!bVar17) {
      node = local_80;
    }
LAB_00107573:
    if ((undefined1 *)local_50._0_8_ != local_38) {
      free((void *)local_50._0_8_);
    }
LAB_00107587:
    if (bVar17) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  #define TF_INVOKE_CONTINUATION()  \
  if (cache) {                      \
    node = cache;                   \
    goto begin_invoke;              \
  }

  begin_invoke:

  Node* cache {nullptr};
  
  // if this is the second invoke due to preemption, directly jump to invoke task
  if(node->_nstate & NSTATE::PREEMPTED) {
    goto invoke_task;
  }

  // if the work has been cancelled, there is no need to continue
  if(node->_is_cancelled()) {
    _tear_down_invoke(worker, node, cache);
    TF_INVOKE_CONTINUATION();
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> waiters;
    if(!node->_acquire_all(waiters)) {
      _schedule(worker, waiters.begin(), waiters.end());
      return;
    }
  }
  
  invoke_task:
  
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;
    
    // runtime task
    case Node::RUNTIME:{
      if(_invoke_runtime_task(worker, node)) {
        return;
      }
    }
    break;

    // subflow task
    case Node::SUBFLOW: {
      if(_invoke_subflow_task(worker, node)) {
        return;
      }
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      if(_invoke_module_task(worker, node)) {
        return;
      }
    }
    break;

    // async task
    case Node::ASYNC: {
      if(_invoke_async_task(worker, node)) {
        return;
      }
      _tear_down_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // dependent async task
    case Node::DEPENDENT_ASYNC: {
      if(_invoke_dependent_async_task(worker, node)) {
        return;
      }
      _tear_down_dependent_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    SmallVector<Node*> waiters;
    node->_release_all(waiters);
    _schedule(worker, waiters.begin(), waiters.end());
  }

  // Reset the join counter with strong dependencies to support cycles.
  // + We must do this before scheduling the successors to avoid race
  //   condition on _predecessors.
  // + We must use fetch_add instead of direct assigning
  //   because the user-space call on "invoke" may explicitly schedule 
  //   this task again (e.g., pipeline) which can access the join_counter.
  node->_join_counter.fetch_add(
    node->num_predecessors() - (node->_nstate & ~NSTATE::MASK), std::memory_order_relaxed
  );

  // acquire the parent flow counter
  auto& join_counter = (node->_parent) ? node->_parent->_join_counter :
                       node->_topology->_join_counter;

  // Invoke the task based on the corresponding type
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_num_successors) {
          auto s = node->_edges[cond]; 
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_num_successors; ++i) {
        //if(auto s = node->_successors[i]; --(s->_join_counter) == 0) {
        if(auto s = node->_edges[i]; s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;
  }
  
  // clean up the node after execution
  _tear_down_invoke(worker, node, cache);
  TF_INVOKE_CONTINUATION();
}